

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SscReader::EndStep(SscReader *this)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  ulong uVar7;
  char cVar8;
  ScopedTimer __var281;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong __val;
  
  if (EndStep()::__var81 == '\0') {
    iVar4 = __cxa_guard_acquire(&EndStep()::__var81);
    if (iVar4 != 0) {
      uVar6 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,"virtual void adios2::core::engine::SscReader::EndStep()",0x51);
      EndStep::__var81 = (void *)ps_timer_create_(uVar6);
      __cxa_guard_release(&EndStep()::__var81);
    }
  }
  __var281.m_timer = EndStep::__var81;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Engine","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SscReader","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EndStep","");
  iVar4 = (*((this->m_EngineInstance).
             super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_SscReaderBase[3])();
  __val = CONCAT44(extraout_var,iVar4);
  cVar8 = '\x01';
  if (9 < __val) {
    uVar7 = __val;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00141a8a;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00141a8a;
      }
      if (uVar7 < 10000) goto LAB_00141a8a;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_00141a8a:
  iVar4 = 0;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
  if (9 < this->m_Verbosity) {
    iVar4 = adios2::helper::Comm::Rank();
  }
  iVar5 = adios2::helper::Comm::Rank();
  adios2::helper::Log((string *)local_50,(string *)local_90,(string *)local_70,(string *)&__str,
                      iVar4,iVar5,5,this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_SscReaderBase[5])(peVar1,(ulong)(byte)this->field_0x83);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var281);
  return;
}

Assistant:

void SscReader::EndStep()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    helper::Log("Engine", "SscReader", "EndStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return m_EngineInstance->EndStep(m_ReaderSelectionsLocked);
}